

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QOpenFolderLineEdit.cpp
# Opt level: O0

void QOpenFolderLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  ActionPosition *pAVar2;
  ActionPosition AVar3;
  Options OVar4;
  QOpenFolderLineEdit *this;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  QOpenFolderLineEdit *in_RDI;
  void *_v_1;
  QOpenFolderLineEdit *_t_2;
  void *_v;
  QOpenFolderLineEdit *_t_1;
  int *result;
  QOpenFolderLineEdit *_t;
  undefined4 in_stack_ffffffffffffff48;
  ActionPosition in_stack_ffffffffffffff4c;
  QString *in_stack_ffffffffffffff50;
  QString *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff64;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      embededActionPositionChanged
                ((QOpenFolderLineEdit *)((ulong)in_stack_ffffffffffffff64 << 0x20),
                 (ActionPosition)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    }
    else if (in_EDX == 1) {
      filePathChanged((QOpenFolderLineEdit *)CONCAT44(in_stack_ffffffffffffff64,1),
                      in_stack_ffffffffffffff58);
    }
  }
  else if (in_ESI == 5) {
    pcVar1 = *(code **)in_RCX[1];
    if (pcVar1 == embededActionPositionChanged &&
        (pcVar1 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
      *(undefined4 *)*in_RCX = 0;
    }
    else {
      pcVar1 = *(code **)in_RCX[1];
      if (pcVar1 == filePathChanged && (pcVar1 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
        *(undefined4 *)*in_RCX = 1;
      }
    }
  }
  else if (in_ESI == 1) {
    pAVar2 = (ActionPosition *)*in_RCX;
    switch(in_EDX) {
    case 0:
      AVar3 = embededActionPosition(in_RDI);
      *pAVar2 = AVar3;
      break;
    case 1:
      filePath((QOpenFolderLineEdit *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
      ;
      QString::operator=(in_stack_ffffffffffffff50,
                         (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QString::~QString((QString *)0x1d782e);
      break;
    case 2:
      caption((QOpenFolderLineEdit *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QString::operator=(in_stack_ffffffffffffff50,
                         (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QString::~QString((QString *)0x1d7861);
      break;
    case 3:
      directory((QOpenFolderLineEdit *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
               );
      QString::operator=(in_stack_ffffffffffffff50,
                         (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QString::~QString((QString *)0x1d7891);
      break;
    case 4:
      OVar4 = options((QOpenFolderLineEdit *)
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      *pAVar2 = OVar4.i;
    }
  }
  else if (in_ESI == 2) {
    this = (QOpenFolderLineEdit *)(ulong)in_EDX;
    switch(this) {
    case (QOpenFolderLineEdit *)0x0:
      setEmbededActionPosition(this,in_stack_ffffffffffffff4c);
      break;
    case (QOpenFolderLineEdit *)0x1:
      setFilePath(this,(QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      break;
    case (QOpenFolderLineEdit *)0x2:
      setCaption(this,(QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      break;
    case (QOpenFolderLineEdit *)0x3:
      setDirectory(this,(QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      break;
    case (QOpenFolderLineEdit *)0x4:
      setOptions((QOpenFolderLineEdit *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),(Options)0x0);
    }
  }
  return;
}

Assistant:

void QOpenFolderLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QOpenFolderLineEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->embededActionPositionChanged((*reinterpret_cast< std::add_pointer_t<QLineEdit::ActionPosition>>(_a[1]))); break;
        case 1: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QOpenFolderLineEdit::*)(QLineEdit::ActionPosition );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QOpenFolderLineEdit::embededActionPositionChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QOpenFolderLineEdit::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QOpenFolderLineEdit::filePathChanged)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QOpenFolderLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QLineEdit::ActionPosition*>(_v) = _t->embededActionPosition(); break;
        case 1: *reinterpret_cast< QString*>(_v) = _t->filePath(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 3: *reinterpret_cast< QString*>(_v) = _t->directory(); break;
        case 4: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QOpenFolderLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEmbededActionPosition(*reinterpret_cast< QLineEdit::ActionPosition*>(_v)); break;
        case 1: _t->setFilePath(*reinterpret_cast< QString*>(_v)); break;
        case 2: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 4: _t->setOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}